

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  usize uVar3;
  Iterator *pIVar4;
  String *this_00;
  char **ppcVar5;
  undefined8 extraout_RAX;
  uint in_ECX;
  Map<String,_String> local_128;
  char *local_70;
  Iterator local_68;
  Iterator end;
  Iterator local_50;
  Iterator i;
  Array<const_char_*> argv;
  Map<String,_String> *environment_local;
  uint streams_local;
  List<String> *args_local;
  String *executable_local;
  Process *this_local;
  
  uVar3 = List<String>::size(___oflag);
  Array<const_char_*>::Array((Array<const_char_*> *)&i,uVar3);
  pIVar4 = List<String>::begin(___oflag);
  local_50.item = pIVar4->item;
  pIVar4 = List<String>::end(___oflag);
  local_68.item = pIVar4->item;
  while( true ) {
    bVar1 = List<String>::Iterator::operator!=(&local_50,&local_68);
    if (!bVar1) break;
    this_00 = List<String>::Iterator::operator*(&local_50);
    local_70 = String::operator_cast_to_char_(this_00);
    Array<const_char_*>::append((Array<const_char_*> *)&i,&local_70);
    List<String>::Iterator::operator++(&local_50);
  }
  uVar3 = List<String>::size(___oflag);
  ppcVar5 = Array::operator_cast_to_char__((Array *)&i);
  Map<String,_String>::Map(&local_128);
  iVar2 = open(this,__file,(int)uVar3,ppcVar5,(ulong)in_ECX,&local_128);
  Map<String,_String>::~Map(&local_128);
  Array<const_char_*>::~Array((Array<const_char_*> *)&i);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),(char)iVar2) & 0xffffff01;
}

Assistant:

bool Process::open(const String& executable, const List<String>& args, uint streams, const Map<String, String>& environment)
{
  Array<const char*> argv(args.size());
  for (List<String>::Iterator i = args.begin(), end = args.end(); i != end; ++i)
    argv.append((const char*)*i);
  return open(executable, (int)args.size(), (char**)(const char**)argv, streams);
}